

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unzip.c
# Opt level: O1

int unzGetCurrentFileInfo
              (unzFile file,unz_file_info *pfile_info,char *szFileName,uLong fileNameBufferSize,
              void *extraField,uLong extraFieldBufferSize,char *szComment,uLong commentBufferSize)

{
  int iVar1;
  unz_file_info64 file_info64;
  unz_file_info64 local_90;
  
  iVar1 = unz64local_GetCurrentFileInfoInternal
                    (file,&local_90,(unz_file_info64_internal *)0x0,szFileName,fileNameBufferSize,
                     extraField,extraFieldBufferSize,szComment,commentBufferSize);
  if (iVar1 == 0) {
    pfile_info->version = local_90.version;
    pfile_info->version_needed = local_90.version_needed;
    pfile_info->flag = local_90.flag;
    pfile_info->compression_method = local_90.compression_method;
    pfile_info->dosDate = local_90.dosDate;
    pfile_info->crc = local_90.crc;
    pfile_info->size_filename = local_90.size_filename;
    pfile_info->size_file_extra = local_90.size_file_extra;
    pfile_info->size_file_comment = local_90.size_file_comment;
    pfile_info->disk_num_start = local_90.disk_num_start;
    pfile_info->internal_fa = local_90.internal_fa;
    pfile_info->external_fa = local_90.external_fa;
    (pfile_info->tmu_date).tm_sec = local_90.tmu_date.tm_sec;
    (pfile_info->tmu_date).tm_min = local_90.tmu_date.tm_min;
    (pfile_info->tmu_date).tm_hour = local_90.tmu_date.tm_hour;
    (pfile_info->tmu_date).tm_mday = local_90.tmu_date.tm_mday;
    (pfile_info->tmu_date).tm_mon = local_90.tmu_date.tm_mon;
    (pfile_info->tmu_date).tm_year = local_90.tmu_date.tm_year;
    pfile_info->compressed_size = local_90.compressed_size;
    pfile_info->uncompressed_size = local_90.uncompressed_size;
  }
  return iVar1;
}

Assistant:

extern int ZEXPORT unzGetCurrentFileInfo(unzFile file,
    unz_file_info* pfile_info,
    char* szFileName, uLong fileNameBufferSize,
    void* extraField, uLong extraFieldBufferSize,
    char* szComment, uLong commentBufferSize)
{
    int err;
    unz_file_info64 file_info64;
    err = unz64local_GetCurrentFileInfoInternal(file, &file_info64, NULL,
        szFileName, fileNameBufferSize,
        extraField, extraFieldBufferSize,
        szComment, commentBufferSize);
    if (err == UNZ_OK)
    {
        pfile_info->version = file_info64.version;
        pfile_info->version_needed = file_info64.version_needed;
        pfile_info->flag = file_info64.flag;
        pfile_info->compression_method = file_info64.compression_method;
        pfile_info->dosDate = file_info64.dosDate;
        pfile_info->crc = file_info64.crc;

        pfile_info->size_filename = file_info64.size_filename;
        pfile_info->size_file_extra = file_info64.size_file_extra;
        pfile_info->size_file_comment = file_info64.size_file_comment;

        pfile_info->disk_num_start = file_info64.disk_num_start;
        pfile_info->internal_fa = file_info64.internal_fa;
        pfile_info->external_fa = file_info64.external_fa;

        pfile_info->tmu_date = file_info64.tmu_date,


            pfile_info->compressed_size = (uLong)file_info64.compressed_size;
        pfile_info->uncompressed_size = (uLong)file_info64.uncompressed_size;

    }
    return err;
}